

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O3

ostream * Indexing::operator<<
                    (ostream *out,
                    LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *self)

{
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *puVar1;
  Node *pNVar2;
  Symbol *self_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *puVar6;
  uint uVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  puVar6 = (self->_trees)._stack;
  puVar1 = (self->_trees)._cursor;
  if (puVar6 != puVar1) {
    uVar7 = 0;
    bVar3 = false;
    do {
      pNVar2 = ((puVar6->_M_t).
                super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                .
                super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_false>
               ._M_head_impl)->_root;
      if (pNVar2 != (Node *)0x0) {
        iVar4 = (*pNVar2->_vptr_Node[3])();
        if ((char)iVar4 == '\0') {
          self_00 = *(Symbol **)(*(long *)(DAT_00b521b0 + 0x80) + (ulong)(uVar7 >> 1) * 8);
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>(out,"~",1);
          }
          poVar5 = Kernel::operator<<(out,self_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
          poVar5 = operator<<(poVar5,(puVar6->_M_t).
                                     super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                                     .
                                     super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_*,_false>
                                     ._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), ",3);
        }
      }
      uVar7 = uVar7 + 1;
      bVar3 = (bool)(bVar3 ^ 1);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"} ",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, LiteralSubstitutionTree const& self)
  { 
    int i = 0;
    out << "{ ";
    for (auto& t : self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        if (idxIsNegative(i)) out << "~";
        out << *f << "(" << *t << "), "; 
      }
      i++;
    }
    return out << "} ";
  }